

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer.h
# Opt level: O0

void __thiscall
ModuleAnnotator::annotate
          (ModuleAnnotator *this,
          set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *criteria)

{
  bool bVar1;
  Offset *this_00;
  LLVMDataDependenceAnalysis *dda;
  LLVMPointerAnalysis *this_01;
  Module *pMVar2;
  long *in_RDI;
  Module *M;
  LLVMDGAssemblyAnnotationWriter *annot;
  string module_comment;
  raw_os_ostream outputstream;
  ofstream ofs;
  string fl;
  undefined4 in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff96c;
  undefined4 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff970;
  string *in_stack_fffffffffffff978;
  LLVMPointerAnalysis *in_stack_fffffffffffff980;
  AnnotationOptsT o;
  LLVMDGAssemblyAnnotationWriter *this_02;
  allocator *this_03;
  int __val;
  string *this_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_588 [32];
  string local_568 [32];
  Offset local_548;
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  AssemblyAnnotationWriter local_2a0 [72];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258 [519];
  allocator local_51;
  undefined1 local_50 [80];
  
  this_04 = (string *)(local_50 + 0x20);
  std::__cxx11::string::string(this_04,(string *)(*in_RDI + 0x230));
  this_03 = &local_51;
  std::allocator<char>::allocator();
  this_02 = (LLVMDGAssemblyAnnotationWriter *)local_50;
  std::__cxx11::string::string((string *)this_02,"-debug.ll",this_03);
  replace_suffix(this_04,(string *)this_02);
  std::__cxx11::string::~string((string *)this_02);
  std::allocator<char>::~allocator((allocator<char> *)this_03);
  __lhs = local_258;
  std::ofstream::ofstream(__lhs,this_04,0x10);
  llvm::raw_os_ostream::raw_os_ostream
            ((raw_os_ostream *)in_stack_fffffffffffff970,
             (ostream *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  std::operator+((char *)this_03,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
  __val = (int)((ulong)this_03 >> 0x20);
  std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
  std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
  std::operator+(in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
  std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
  std::operator+(in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
  std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
  std::__cxx11::to_string(__val);
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_04)
  ;
  std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
  std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
  std::__cxx11::to_string(__val);
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_04)
  ;
  std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
  std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
  (anonymous_namespace)::undefFunsBehaviorToStr_abi_cxx11_
            ((UndefinedFunsBehavior)((ulong)in_stack_fffffffffffff978 >> 0x20));
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_04)
  ;
  std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
  std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string(local_300);
  std::__cxx11::string::~string(local_540);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string(local_520);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::string::~string(local_500);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::string::~string(local_400);
  std::__cxx11::string::~string(local_420);
  std::__cxx11::string::~string(local_440);
  std::__cxx11::string::~string(local_460);
  std::__cxx11::string::~string(local_480);
  std::__cxx11::string::~string(local_4a0);
  std::__cxx11::string::~string(local_4c0);
  std::__cxx11::string::~string(local_4e0);
  switch(*(undefined4 *)(*in_RDI + 0x68)) {
  case 0:
    std::__cxx11::string::operator+=(local_2c0,"flow-insensitive\n");
    break;
  case 1:
    std::__cxx11::string::operator+=(local_2c0,"flow-sensitive\n");
    break;
  case 2:
    std::__cxx11::string::operator+=(local_2c0,"flow-sensitive with invalidate\n");
    break;
  case 3:
    std::__cxx11::string::operator+=(local_2c0,"SVF\n");
  }
  std::__cxx11::string::operator+=(local_2c0,";   * PTA field sensitivity: ");
  this_00 = (Offset *)(*in_RDI + 0x20);
  dg::Offset::Offset(&local_548,dg::Offset::UNKNOWN);
  bVar1 = dg::Offset::operator==(this_00,&local_548);
  if (bVar1) {
    std::__cxx11::string::operator+=(local_2c0,"full\n\n");
    o = (AnnotationOptsT)((ulong)this_00 >> 0x20);
  }
  else {
    dg::Offset::operator*((Offset *)(*in_RDI + 0x20));
    std::__cxx11::to_string((unsigned_long)this_00);
    o = (AnnotationOptsT)((ulong)this_00 >> 0x20);
    std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
    std::__cxx11::string::operator+=(local_2c0,local_568);
    std::__cxx11::string::~string(local_568);
    std::__cxx11::string::~string(local_588);
  }
  llvm::errs();
  llvm::raw_ostream::operator<<
            ((raw_ostream *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
  llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  llvm::raw_ostream::operator<<
            ((raw_ostream *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
  dda = (LLVMDataDependenceAnalysis *)operator_new(0x48);
  uVar3 = (undefined4)in_RDI[2];
  this_01 = dg::LLVMDependenceGraph::getPTA((LLVMDependenceGraph *)in_RDI[1]);
  dg::LLVMDependenceGraph::getDDA((LLVMDependenceGraph *)in_RDI[1]);
  dg::debug::LLVMDGAssemblyAnnotationWriter::LLVMDGAssemblyAnnotationWriter
            (this_02,o,in_stack_fffffffffffff980,dda,
             (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
             this_01);
  dg::debug::LLVMDGAssemblyAnnotationWriter::emitModuleComment
            ((LLVMDGAssemblyAnnotationWriter *)this_01,
             (string *)CONCAT44(uVar3,in_stack_fffffffffffff968));
  pMVar2 = dg::LLVMDependenceGraph::getModule((LLVMDependenceGraph *)in_RDI[1]);
  llvm::Module::print((raw_ostream *)pMVar2,local_2a0,SUB81(dda,0),false);
  if (dda != (LLVMDataDependenceAnalysis *)0x0) {
    (**(code **)(dda->m + 8))();
  }
  std::__cxx11::string::~string(local_2c0);
  llvm::raw_os_ostream::~raw_os_ostream((raw_os_ostream *)local_2a0);
  std::ofstream::~ofstream(local_258);
  std::__cxx11::string::~string((string *)(local_50 + 0x20));
  return;
}

Assistant:

void annotate(const std::set<LLVMNode *> *criteria = nullptr) {
        // compose name
        std::string fl(options.inputFile);
        replace_suffix(fl, "-debug.ll");

        // open stream to write to
        std::ofstream ofs(fl);
        llvm::raw_os_ostream outputstream(ofs);

        std::string module_comment =
                "; -- Generated by llvm-slicer --\n"
                ";   * slicing criteria: '" +
                options.slicingCriteria + "'\n" +
                ";   * legacy slicing criteria: '" +
                options.legacySlicingCriteria + "'\n" +
                ";   * legacy secondary slicing criteria: '" +
                options.legacySecondarySlicingCriteria + "'\n" +
                ";   * forward slice: '" +
                std::to_string(options.forwardSlicing) + "'\n" +
                ";   * remove slicing criteria: '" +
                std::to_string(options.removeSlicingCriteria) + "'\n" +
                ";   * undefined functions behavior: '" +
                undefFunsBehaviorToStr(
                        options.dgOptions.DDAOptions.undefinedFunsBehavior) +
                "'\n" + ";   * pointer analysis: ";

        using AnalysisType = LLVMPointerAnalysisOptions::AnalysisType;
        switch (options.dgOptions.PTAOptions.analysisType) {
        case AnalysisType::fi:
            module_comment += "flow-insensitive\n";
            break;
        case AnalysisType::fs:
            module_comment += "flow-sensitive\n";
            break;
        case AnalysisType::inv:
            module_comment += "flow-sensitive with invalidate\n";
            break;
        case AnalysisType::svf:
            module_comment += "SVF\n";
            break;
        }

        module_comment += ";   * PTA field sensitivity: ";
        if (options.dgOptions.PTAOptions.fieldSensitivity == Offset::UNKNOWN)
            module_comment += "full\n\n";
        else
            module_comment +=
                    std::to_string(
                            *options.dgOptions.PTAOptions.fieldSensitivity) +
                    "\n\n";

        llvm::errs() << "[llvm-slicer] Saving IR with annotations to " << fl
                     << "\n";
        auto *annot = new dg::debug::LLVMDGAssemblyAnnotationWriter(
                annotationOptions, dg->getPTA(), dg->getDDA(), criteria);
        annot->emitModuleComment(std::move(module_comment));
        llvm::Module *M = dg->getModule();
        M->print(outputstream, annot);

        delete annot;
    }